

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall tinyusdz::ListOp<unsigned_int>::~ListOp(ListOp<unsigned_int> *this)

{
  ListOp<unsigned_int> *this_local;
  
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->ordered_items);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->deleted_items);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->appended_items);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->prepended_items);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->added_items);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->explicit_items);
  return;
}

Assistant:

ListOp() : is_explicit(false) {}